

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O1

HRESULT __thiscall Js::SimpleDataCacheWrapper::ReadHeader(SimpleDataCacheWrapper *this)

{
  HRESULT HVar1;
  DWORD local_20;
  DWORD local_1c;
  DWORD jscriptMajorVersion;
  DWORD jscriptMinorVersion;
  
  HVar1 = AutoSystemInfo::GetJscriptFileVersion(&local_20,&local_1c,(DWORD *)0x0,(DWORD *)0x0);
  if ((-1 < HVar1) && (HVar1 = 0, (this->inStream).ptr == (IStream *)0x0)) {
    HVar1 = ReadHeader(this);
  }
  return HVar1;
}

Assistant:

HRESULT SimpleDataCacheWrapper::ReadHeader()
    {
        DWORD jscriptMajorVersion;
        DWORD jscriptMinorVersion;
        HRESULT hr = E_FAIL;

        IFFAILRET(AutoSystemInfo::GetJscriptFileVersion(&jscriptMajorVersion, &jscriptMinorVersion));

        DWORD majorVersion;
        IFFAILRET(Read(&majorVersion));
        if (majorVersion != jscriptMajorVersion)
        {
            return E_FAIL;
        }

        DWORD minorVersion;
        IFFAILRET(Read(&minorVersion));
        if (minorVersion != jscriptMinorVersion)
        {
            return E_FAIL;
        }

        return hr;
    }